

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastener::IfcMechanicalFastener(IfcMechanicalFastener *this)

{
  *(undefined ***)&this->field_0x188 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x190 = 0;
  *(char **)&this->field_0x198 = "IfcMechanicalFastener";
  IfcFastener::IfcFastener(&this->super_IfcFastener,&PTR_construction_vtable_24__0088e800);
  *(undefined8 *)&(this->super_IfcFastener).field_0x160 = 0;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject = 0x88e6a8;
  *(undefined8 *)&this->field_0x188 = 0x88e7e8;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0x88 = 0x88e6d0;
  (this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
  super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x88e6f8;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0xd0 = 0x88e720;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    field_0x100 = 0x88e748;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x138 =
       0x88e770;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x148 =
       0x88e798;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.field_0x158 = 0x88e7c0;
  this->field_0x170 = 0;
  (this->NominalLength).have = false;
  return;
}

Assistant:

IfcMechanicalFastener() : Object("IfcMechanicalFastener") {}